

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::find
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type_conflict *k)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  treeNode<int> **pptVar5;
  node *n;
  
  pptVar5 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_root
  ;
  do {
    n = *pptVar5;
    do {
      bVar3 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::validNode
                        (&this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>,n)
      ;
      if (!bVar3) {
        n = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last;
LAB_00104c39:
        __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
        __return_storage_ptr__->m_tree =
             &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
        __return_storage_ptr__->m_node = n;
        return __return_storage_ptr__;
      }
      iVar1 = n->value;
      iVar2 = *k;
      if (iVar2 == iVar1) goto LAB_00104c39;
      if (iVar2 != iVar1 && iVar1 <= iVar2) {
        lVar4 = 0x10;
        break;
      }
      lVar4 = 8;
    } while (iVar1 <= iVar2);
    pptVar5 = (treeNode<int> **)((long)&n->value + lVar4);
  } while( true );
}

Assistant:

iterator		find(key_type const & k)
	{
		node*	node(this->root());
		while (this->validNode(node))
		{
			if (this->equal(node->value, k)) return iterator(this->m_tree, node);
			else if (this->key_comp()(node->value, k)) node = node->right;
			else if (this->key_comp()(k, node->value)) node = node->left;
		}
		return this->end();
	}